

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

iterator anon_unknown.dwarf_dd40c::findByName<VulkanHppGenerator::EnumValueData>
                   (vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
                    *values,string *name)

{
  EnumValueData *pEVar1;
  __type_conflict _Var2;
  EnumValueData *pEVar3;
  
  pEVar3 = (values->
           super__Vector_base<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (values->
           super__Vector_base<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pEVar3 == pEVar1) {
      return (iterator)pEVar3;
    }
    _Var2 = std::operator==(&pEVar3->name,name);
    if (_Var2) break;
    pEVar3 = pEVar3 + 1;
  }
  return (iterator)pEVar3;
}

Assistant:

typename std::vector<T>::iterator findByName( std::vector<T> & values, std::string const & name )
  {
    return std::ranges::find_if( values, [&name]( T const & value ) { return value.name == name; } );
  }